

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::makeCallIndirect<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,bool isReturn)

{
  __index_type *__return_storage_ptr___00;
  Name *table_00;
  HeapType *pHVar1;
  bool bVar2;
  Err local_138;
  Err *local_118;
  Err *err_1;
  Result<wasm::HeapType> _val_1;
  Result<wasm::HeapType> type;
  Err local_b8;
  Err *local_98;
  Err *err;
  undefined1 local_80 [8];
  MaybeResult<wasm::Name> _val;
  MaybeResult<wasm::Name> table;
  bool isReturn_local;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  Index pos_local;
  ParseDefsCtx *ctx_local;
  
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20);
  maybeTableidx<wasm::WATParser::ParseDefsCtx>
            ((MaybeResult<wasm::Name> *)__return_storage_ptr___00,ctx);
  MaybeResult<wasm::Name>::MaybeResult
            ((MaybeResult<wasm::Name> *)local_80,
             (MaybeResult<wasm::Name> *)__return_storage_ptr___00);
  local_98 = MaybeResult<wasm::Name>::getErr((MaybeResult<wasm::Name> *)local_80);
  bVar2 = local_98 == (Err *)0x0;
  if (!bVar2) {
    wasm::Err::Err(&local_b8,local_98);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_b8);
    wasm::Err::~Err(&local_b8);
  }
  MaybeResult<wasm::Name>::~MaybeResult((MaybeResult<wasm::Name> *)local_80);
  if (bVar2) {
    typeuse<wasm::WATParser::ParseDefsCtx>
              ((Result<wasm::HeapType> *)
               ((long)&_val_1.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                       super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                       super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                       super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 0x20),ctx,false);
    Result<wasm::HeapType>::Result
              ((Result<wasm::HeapType> *)&err_1,
               (Result<wasm::HeapType> *)
               ((long)&_val_1.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                       super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                       super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                       super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 0x20));
    local_118 = Result<wasm::HeapType>::getErr((Result<wasm::HeapType> *)&err_1);
    bVar2 = local_118 == (Err *)0x0;
    if (!bVar2) {
      wasm::Err::Err(&local_138,local_118);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_138);
      wasm::Err::~Err(&local_138);
    }
    Result<wasm::HeapType>::~Result((Result<wasm::HeapType> *)&err_1);
    if (bVar2) {
      table_00 = MaybeResult<wasm::Name>::getPtr
                           ((MaybeResult<wasm::Name> *)
                            ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20
                            ));
      pHVar1 = Result<wasm::HeapType>::operator*
                         ((Result<wasm::HeapType> *)
                          ((long)&_val_1.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                                  super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 0x20));
      ParseDefsCtx::makeCallIndirect
                (__return_storage_ptr__,ctx,pos,annotations,table_00,(HeapType)pHVar1->id,isReturn);
    }
    Result<wasm::HeapType>::~Result
              ((Result<wasm::HeapType> *)
               ((long)&_val_1.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                       super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                       super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                       super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 0x20));
  }
  MaybeResult<wasm::Name>::~MaybeResult
            ((MaybeResult<wasm::Name> *)
             ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<> makeCallIndirect(Ctx& ctx,
                          Index pos,
                          const std::vector<Annotation>& annotations,
                          bool isReturn) {
  auto table = maybeTableidx(ctx);
  CHECK_ERR(table);
  auto type = typeuse(ctx, false);
  CHECK_ERR(type);
  return ctx.makeCallIndirect(
    pos, annotations, table.getPtr(), *type, isReturn);
}